

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutTests.cpp
# Opt level: O0

offset_in_this_suite_class_to_subr
agge::tests::LayoutTests::__MultiLineUnboundLayoutBoxEqualsMaxOfSumOfAdvancesInEachRow_meta
          (char **name)

{
  char **name_local;
  
  *name = "MultiLineUnboundLayoutBoxEqualsMaxOfSumOfAdvancesInEachRow";
  return (offset_in_this_suite_class_to_subr)
         MultiLineUnboundLayoutBoxEqualsMaxOfSumOfAdvancesInEachRow;
}

Assistant:

test( MultiLineUnboundLayoutBoxEqualsMaxOfSumOfAdvancesInEachRow )
			{
				// INIT
				mocks::font_accessor::char_to_index indices[] = { { L' ', 0 }, { L'A', 1 }, { L'B', 2 }, { L'C', 3 }, };
				mocks::font_accessor::glyph glyphs[] = {
					{ { 7.1, 0 } },
					{ { 11, 0 } },
					{ { 13, 0 } },
					{ { 17, 0 } },
				};
				factory_ptr f = create_single_font_factory(c_fm1, indices, glyphs);

				// ACT
				layout l1;
				layout l2;
				layout l3;

				l1.process(R("ABC CBA AB\nABB BBC\n"), limit::none(), *f);
				l2.process(R("AC CB\nA AB\nABB BBC\n"), limit::none(), *f);
				l3.process(R("AC CB\nA AB\nABB BBC"), limit::none(), *f); // Last row will be checked even if no newline is encountered.

				box_r box1 = l1.get_box();
				box_r box2 = l2.get_box();
				box_r box3 = l3.get_box();

				// ASSERT
				assert_equal(120.2f, box1.w);
				assert_equal(87.1f, box2.w);
				assert_equal(87.1f, box3.w);
			}